

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::SequenceCatalogEntry::Copy(SequenceCatalogEntry *this,ClientContext *context)

{
  Catalog *catalog;
  SchemaCatalogEntry *schema;
  __uniq_ptr_impl<duckdb::SequenceCatalogEntry,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  _Var1;
  CreateSequenceInfo *info;
  tuple<duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_> this_00;
  pointer pSVar2;
  templated_unique_single_t result;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> info_copy;
  __uniq_ptr_impl<duckdb::SequenceCatalogEntry,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  local_80;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_78;
  SequenceData local_70;
  
  (*(code *)(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config).
            home_directory._M_string_length)(&local_78);
  info = (CreateSequenceInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&local_78);
  catalog = (Catalog *)(context->config).max_expression_depth;
  schema = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  this_00.
  super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
        )operator_new(0x188);
  SequenceCatalogEntry
            ((SequenceCatalogEntry *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
             .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl,catalog,
             schema,info);
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>)
       (tuple<duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
       .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl;
  GetData(&local_70,(SequenceCatalogEntry *)context);
  pSVar2 = unique_ptr<duckdb::SequenceCatalogEntry,_std::default_delete<duckdb::SequenceCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SequenceCatalogEntry,_std::default_delete<duckdb::SequenceCatalogEntry>,_true>
                         *)&local_80);
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl =
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
       .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl;
  *(uint *)((long)&(pSVar2->data).min_value + 1) =
       CONCAT13(local_70.min_value._4_1_,local_70.min_value._1_3_);
  *(uint *)((long)&(pSVar2->data).min_value + 5) =
       CONCAT13((undefined1)local_70.max_value,local_70.min_value._5_3_);
  *(undefined4 *)((long)&(pSVar2->data).max_value + 1) = local_70.max_value._1_4_;
  *(undefined4 *)((long)&(pSVar2->data).max_value + 5) = local_70._53_4_;
  *(undefined4 *)&(pSVar2->data).start_value = (undefined4)local_70.start_value;
  *(undefined4 *)((long)&(pSVar2->data).start_value + 4) = local_70.start_value._4_4_;
  *(undefined4 *)&(pSVar2->data).min_value = (undefined4)local_70.min_value;
  *(undefined4 *)((long)&(pSVar2->data).min_value + 4) = local_70.min_value._4_4_;
  *(undefined4 *)&(pSVar2->data).last_value = (undefined4)local_70.last_value;
  *(undefined4 *)((long)&(pSVar2->data).last_value + 4) = local_70.last_value._4_4_;
  *(undefined4 *)&(pSVar2->data).increment = (undefined4)local_70.increment;
  *(undefined4 *)((long)&(pSVar2->data).increment + 4) = local_70.increment._4_4_;
  *(undefined4 *)&(pSVar2->data).usage_count = (undefined4)local_70.usage_count;
  *(undefined4 *)((long)&(pSVar2->data).usage_count + 4) = local_70.usage_count._4_4_;
  *(undefined4 *)&(pSVar2->data).counter = (undefined4)local_70.counter;
  *(undefined4 *)((long)&(pSVar2->data).counter + 4) = local_70.counter._4_4_;
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
  .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>)
       (_Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
        )0x0;
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_duckdb::SequenceCatalogEntry_*,_std::default_delete<duckdb::SequenceCatalogEntry>_>
       .super__Head_base<0UL,_duckdb::SequenceCatalogEntry_*,_false>._M_head_impl;
  if (local_78._M_head_impl != (CreateInfo *)0x0) {
    (*((local_78._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> SequenceCatalogEntry::Copy(ClientContext &context) const {
	auto info_copy = GetInfo();
	auto &cast_info = info_copy->Cast<CreateSequenceInfo>();

	auto result = make_uniq<SequenceCatalogEntry>(catalog, schema, cast_info);
	result->data = GetData();

	return std::move(result);
}